

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

Translator * __thiscall helics::Federate::getTranslator(Federate *this,string_view translatorName)

{
  ConnectorFederateManager *this_00;
  Translator *pTVar1;
  string_view name;
  string local_48;
  
  pTVar1 = ConnectorFederateManager::getTranslator
                     ((this->cManager)._M_t.
                      super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
                      .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl
                      ,translatorName);
  if ((pTVar1->super_Interface).handle.hid == -1700000000) {
    this_00 = (this->cManager)._M_t.
              super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
              .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
    localNameGenerator_abi_cxx11_(&local_48,this,translatorName);
    name._M_str = local_48._M_dataplus._M_p;
    name._M_len = local_48._M_string_length;
    pTVar1 = ConnectorFederateManager::getTranslator(this_00,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return pTVar1;
}

Assistant:

const Translator& Federate::getTranslator(std::string_view translatorName) const
{
    const Translator& trans = cManager->getTranslator(translatorName);
    if (!trans.isValid()) {
        return cManager->getTranslator(localNameGenerator(translatorName));
    }
    return trans;
}